

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmos.cc
# Opt level: O1

void __thiscall chipemu::implementation::nmos::nmos(nmos *this,void **vtt,chip_description *desc)

{
  pointer *pptVar1;
  pointer *ppptVar2;
  ushort *puVar3;
  ushort uVar4;
  ushort uVar5;
  void *pvVar6;
  bool *pbVar7;
  iterator __position;
  iterator iVar8;
  pointer ptVar9;
  pointer pptVar10;
  pointer puVar11;
  ushort uVar12;
  uint16_t uVar13;
  nmos *pnVar14;
  chip_description *pcVar15;
  pointer pcVar16;
  pointer __result;
  pointer pcVar17;
  ulong uVar18;
  logic_error *this_00;
  out_of_range *this_01;
  _Tp_alloc_type *__alloc;
  uint uVar19;
  long lVar20;
  short sVar21;
  _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  *this_02;
  pointer pcVar22;
  transdef *ptVar23;
  transdef *ptVar24;
  uint16_t *puVar25;
  long lVar26;
  ushort uVar27;
  ushort uVar28;
  ulong uVar29;
  ulong uVar30;
  ushort uVar31;
  bool bVar32;
  undefined1 auVar33 [32];
  vector<unsigned_short,_std::allocator<unsigned_short>_> nodes;
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  cnodes;
  vector<unsigned_short,_std::allocator<unsigned_short>_> node_offsets;
  unsigned_short local_112;
  nmos *local_110;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_108;
  uint local_ec;
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  local_e8;
  pointer local_d0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_c8;
  pointer local_b0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_a8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_a0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_98;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_90;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_88;
  chip_description *local_80;
  ulong local_78;
  pointer local_70;
  vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
  *local_68;
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_60;
  
  pvVar6 = *vtt;
  *(void **)this = pvVar6;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar6 + -0x48)) = vtt[1];
  local_88 = &this->changed_queue;
  local_a8 = &this->current_group;
  local_90 = &this->nodes;
  local_98 = &this->node_offsets;
  local_a0 = &this->change_order;
  (this->group_tail)._M_current = (unsigned_short *)0x0;
  auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
  this->changed_feeding = (iterator)auVar33._0_8_;
  this->current_group = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar33._8_24_;
  this->changed_queue = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar33._0_24_;
  this->changed_eating = (iterator)auVar33._24_8_;
  auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
  this->nodes = (vector<unsigned_short,_std::allocator<unsigned_short>_>)auVar33._0_24_;
  (this->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar33._24_8_;
  *(undefined1 (*) [32])
   &(this->node_offsets).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
    .super__Vector_impl_data._M_finish = auVar33;
  (this->change_order).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->power = desc->node_power;
  this->ground = desc->node_ground;
  local_e8.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __alloc = (_Tp_alloc_type *)0x1;
  local_110 = this;
  pcVar16 = std::
            _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ::_M_allocate((_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                           *)0x1,(size_t)vtt);
  pcVar16->is_pullup = false;
  auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
  pcVar16->gates =
       (vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
        )auVar33._0_24_;
  (pcVar16->sibling_connectors).
  super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar33._24_8_;
  *(undefined1 (*) [32])
   &(pcVar16->gates).
    super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar33;
  local_e8.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       std::
       vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
       ::_S_relocate((pointer)0x0,(pointer)0x0,pcVar16,__alloc);
  local_e8.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_e8.
       super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
       ._M_impl.super__Vector_impl_data._M_finish + 1;
  pcVar22 = pcVar16 + 1;
  local_e8.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_start = pcVar16;
  local_e8.
  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar22;
  local_80 = desc;
  if (desc->node_count != 0) {
    uVar29 = 0;
    local_d0 = pcVar16;
    do {
      pcVar16 = local_e8.
                super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pbVar7 = desc->pullups;
      if (local_e8.
          super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
          ._M_impl.super__Vector_impl_data._M_finish == pcVar22) {
        if ((long)local_e8.
                  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar18 = ((long)local_e8.
                        super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_e8.
                        super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        uVar30 = uVar18;
        if (local_e8.
            super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_e8.
            super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar30 = 1;
        }
        this_02 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   *)(uVar30 + uVar18);
        if ((_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
             *)0x249249249249248 < this_02) {
          this_02 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                     *)0x249249249249249;
        }
        lVar26 = uVar30 + uVar18;
        if (CARRY8(uVar30,uVar18)) {
          this_02 = (_Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                     *)0x249249249249249;
        }
        local_b0 = pcVar22;
        __result = std::
                   _Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                   ::_M_allocate(this_02,0x6db6db6db6db6db7);
        pcVar22 = local_d0;
        lVar20 = (long)pcVar16 - (long)local_d0;
        bVar32 = pbVar7[uVar29];
        *(bool *)((long)__result + lVar20) = bVar32;
        *(undefined1 (*) [32])((long)__result + lVar20 + 8) = ZEXT1632(ZEXT816(0) << 0x40);
        *(undefined1 (*) [32])((long)__result + lVar20 + 0x18) = ZEXT1632(ZEXT816(0) << 0x40);
        pcVar17 = std::
                  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                  ::_S_relocate(local_d0,pcVar16,__result,
                                (_Tp_alloc_type *)CONCAT71((int7)((ulong)lVar26 >> 8),bVar32));
        if (pcVar22 != (pointer)0x0) {
          operator_delete(pcVar22,(long)local_b0 - (long)pcVar22);
        }
        pcVar22 = __result + (long)this_02;
        desc = local_80;
        local_e8.
        super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
        ._M_impl.super__Vector_impl_data._M_start = __result;
        local_e8.
        super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pcVar22;
        local_d0 = __result;
      }
      else {
        (local_e8.
         super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
         ._M_impl.super__Vector_impl_data._M_finish)->is_pullup = pbVar7[uVar29];
        auVar33 = ZEXT1632(ZEXT816(0) << 0x40);
        (local_e8.
         super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
         ._M_impl.super__Vector_impl_data._M_finish)->gates =
             (vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
              )auVar33._0_24_;
        ((local_e8.
          super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
          ._M_impl.super__Vector_impl_data._M_finish)->sibling_connectors).
        super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar33._24_8_;
        *(undefined1 (*) [32])
         &((local_e8.
            super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ._M_impl.super__Vector_impl_data._M_finish)->gates).
          super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar33;
        pcVar17 = local_e8.
                  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      local_e8.
      super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
      ._M_impl.super__Vector_impl_data._M_finish = pcVar17 + 1;
      uVar29 = uVar29 + 1;
    } while (uVar29 < desc->node_count);
  }
  pcVar16 = local_e8.
            super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = &desc->transistors->gate;
  if (desc->transistor_count != 0) {
    uVar29 = ((long)local_e8.
                    super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_e8.
                    super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    ptVar23 = (transdef *)
              local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      uVar31 = ((transdef *)
               local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start)->gate;
      uVar30 = (ulong)uVar31;
      if (((uVar29 < uVar30 || uVar29 - uVar30 == 0) ||
          (uVar4 = ((transdef *)
                   local_60.first.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start)->c1, uVar29 < uVar4 || uVar29 - uVar4 == 0)) ||
         (uVar27 = ((transdef *)
                   local_60.first.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start)->c2, uVar29 < uVar27 || uVar29 - uVar27 == 0))
      {
        this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range(this_01,"node id");
        __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      lVar26 = ((long)local_60.first.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)ptVar23 >> 1) * -0x5555555555555555
               >> 2;
      ptVar24 = ptVar23;
      if (0 < lVar26) {
        ptVar24 = ptVar23 + lVar26 * 4;
        lVar26 = lVar26 + 1;
        ptVar23 = ptVar23 + 2;
        do {
          if ((ptVar23[-2].gate == uVar31) &&
             (((ptVar23[-2].c1 == uVar4 && (ptVar23[-2].c2 == uVar27)) ||
              ((ptVar23[-2].c1 == uVar27 && (ptVar23[-2].c2 == uVar4)))))) {
            ptVar23 = ptVar23 + -2;
            goto LAB_00111b87;
          }
          if ((ptVar23[-1].gate == uVar31) &&
             (((ptVar23[-1].c1 == uVar4 && (ptVar23[-1].c2 == uVar27)) ||
              ((ptVar23[-1].c1 == uVar27 && (ptVar23[-1].c2 == uVar4)))))) {
            ptVar23 = ptVar23 + -1;
            goto LAB_00111b87;
          }
          if ((ptVar23->gate == uVar31) &&
             (((ptVar23->c1 == uVar4 && (ptVar23->c2 == uVar27)) ||
              ((ptVar23->c1 == uVar27 && (ptVar23->c2 == uVar4)))))) goto LAB_00111b87;
          if ((ptVar23[1].gate == uVar31) &&
             (((ptVar23[1].c1 == uVar4 && (ptVar23[1].c2 == uVar27)) ||
              ((ptVar23[1].c1 == uVar27 && (ptVar23[1].c2 == uVar4)))))) {
            ptVar23 = ptVar23 + 1;
            goto LAB_00111b87;
          }
          lVar26 = lVar26 + -1;
          ptVar23 = ptVar23 + 4;
        } while (1 < lVar26);
      }
      lVar26 = ((long)local_60.first.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start - (long)ptVar24 >> 1) * -0x5555555555555555;
      if (lVar26 == 1) {
LAB_00111b42:
        ptVar23 = (transdef *)
                  local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ptVar24->gate == uVar31) &&
           ((((ptVar24->c1 != uVar4 || (ptVar23 = ptVar24, ptVar24->c2 != uVar27)) &&
             (ptVar23 = (transdef *)
                        local_60.first.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start, ptVar24->c1 == uVar27)) &&
            (ptVar23 = ptVar24, ptVar24->c2 != uVar4)))) {
          ptVar23 = (transdef *)
                    local_60.first.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
      else if (lVar26 == 2) {
LAB_00111b1c:
        if ((ptVar24->gate != uVar31) ||
           (((ptVar23 = ptVar24, ptVar24->c1 != uVar4 || (ptVar24->c2 != uVar27)) &&
            ((ptVar24->c1 != uVar27 || (ptVar24->c2 != uVar4)))))) {
          ptVar24 = ptVar24 + 1;
          goto LAB_00111b42;
        }
      }
      else {
        ptVar23 = (transdef *)
                  local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar26 == 3) &&
           ((ptVar24->gate != uVar31 ||
            (((ptVar23 = ptVar24, ptVar24->c1 != uVar4 || (ptVar24->c2 != uVar27)) &&
             ((ptVar24->c1 != uVar27 || (ptVar24->c2 != uVar4)))))))) {
          ptVar24 = ptVar24 + 1;
          goto LAB_00111b1c;
        }
      }
LAB_00111b87:
      if (ptVar23 ==
          (transdef *)
          local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
          .super__Vector_impl_data._M_start) {
        __position._M_current =
             pcVar16[uVar30].gates.
             super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            pcVar16[uVar30].gates.
            super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<chipemu::implementation::transdef,std::allocator<chipemu::implementation::transdef>>
          ::_M_realloc_insert<chipemu::implementation::transdef_const&>
                    ((vector<chipemu::implementation::transdef,std::allocator<chipemu::implementation::transdef>>
                      *)&pcVar16[uVar30].gates,__position,
                     (transdef *)
                     local_60.first.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start);
        }
        else {
          (__position._M_current)->c2 =
               ((transdef *)
               local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start)->c2;
          uVar13 = ((transdef *)
                   local_60.first.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start)->c1;
          (__position._M_current)->gate =
               ((transdef *)
               local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start)->gate;
          (__position._M_current)->c1 = uVar13;
          pptVar1 = &pcVar16[uVar30].gates.
                     super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pptVar1 = *pptVar1 + 1;
        }
        uVar31 = *(uint16_t *)
                  ((long)local_60.first.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + 2);
        iVar8._M_current =
             pcVar16[uVar31].sibling_connectors.
             super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            pcVar16[uVar31].sibling_connectors.
            super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
          ::_M_realloc_insert<chipemu::implementation::transdef_const*const&>
                    ((vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
                      *)&pcVar16[uVar31].sibling_connectors,iVar8,(transdef **)&local_60);
        }
        else {
          *iVar8._M_current =
               (transdef *)
               local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
          ppptVar2 = &pcVar16[uVar31].sibling_connectors.
                      super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar2 = *ppptVar2 + 1;
        }
        uVar31 = *(uint16_t *)
                  ((long)local_60.first.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + 4);
        iVar8._M_current =
             pcVar16[uVar31].sibling_connectors.
             super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar8._M_current ==
            pcVar16[uVar31].sibling_connectors.
            super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
          ::_M_realloc_insert<chipemu::implementation::transdef_const*const&>
                    ((vector<chipemu::implementation::transdef_const*,std::allocator<chipemu::implementation::transdef_const*>>
                      *)&pcVar16[uVar31].sibling_connectors,iVar8,(transdef **)&local_60);
        }
        else {
          *iVar8._M_current =
               (transdef *)
               local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
          ppptVar2 = &pcVar16[uVar31].sibling_connectors.
                      super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *ppptVar2 = *ppptVar2 + 1;
        }
      }
      local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((long)local_60.first.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_start + 6);
      ptVar23 = desc->transistors;
    } while ((transdef *)
             local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start != ptVar23 + desc->transistor_count);
  }
  local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
  local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
  local_112 = 0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_realloc_insert<unsigned_short>
            (&local_c8,(iterator)0x0,&local_112);
  pcVar16 = local_e8.
            super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar29 = ((long)local_e8.
                  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_e8.
                  super__Vector_base<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  if (1 < uVar29) {
    uVar30 = 1;
    uVar31 = 2;
    do {
      uVar18 = (long)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 1;
      if (0xfffe < uVar18) {
        __assert_fail("std::numeric_limits<uint16_t>::max() > nodes.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/GBuella[P]chipemu/src/nmos.cc"
                      ,0x144,
                      "pair<vector<uint16_t>, vector<uint16_t>> chipemu::implementation::create_nodes(const vector<construct_node> &)"
                     );
      }
      local_112 = (unsigned_short)uVar18;
      if (local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_c8,
                   (iterator)
                   local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_112);
      }
      else {
        *local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_112;
        local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_112 = (unsigned_short)pcVar16[uVar30].is_pullup;
      if (local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_108,
                   (iterator)
                   local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_112);
      }
      else {
        *local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_112;
        local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_112 = (short)((uint)(*(int *)&pcVar16[uVar30].gates.
                                          super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                *(int *)&pcVar16[uVar30].gates.
                                         super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 1) * -0x5555;
      if (local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_108,
                   (iterator)
                   local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_112);
      }
      else {
        *local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_112;
        local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_112 = (unsigned_short)
                  ((uint)(*(int *)&pcVar16[uVar30].sibling_connectors.
                                   super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                         *(int *)&pcVar16[uVar30].sibling_connectors.
                                  super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
      if (local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
        _M_realloc_insert<unsigned_short>
                  (&local_108,
                   (iterator)
                   local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_112);
      }
      else {
        *local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish = local_112;
        local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&local_108,
                 ((ulong)((long)pcVar16[uVar30].gates.
                                super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pcVar16[uVar30].gates.
                               super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 1) * 0x5555555555555556
                 + ((long)local_108.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_108.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 1));
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                (&local_108,
                 ((long)pcVar16[uVar30].sibling_connectors.
                        super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)pcVar16[uVar30].sibling_connectors.
                        super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) +
                 ((long)local_108.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_108.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start >> 1));
      uVar30 = (ulong)uVar31;
      uVar31 = uVar31 + 1;
    } while (uVar30 <= uVar29 && uVar29 - uVar30 != 0);
    if (1 < uVar29) {
      uVar19 = 1;
      uVar30 = 1;
      do {
        ptVar9 = pcVar16[uVar30].gates.
                 super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar26 = (long)pcVar16[uVar30].gates.
                       super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar9;
        if (lVar26 != 0) {
          uVar18 = (lVar26 >> 1) * -0x5555555555555555;
          lVar26 = (ulong)*(ushort *)
                           ((bool *)local_c8.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar30 * 2) * 2;
          puVar25 = &ptVar9->c2;
          uVar30 = 0;
          do {
            *(uint16_t *)
             ((undefined1 *)
              ((long)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start + 6) + uVar30 * 4 + lVar26) =
                 puVar25[-1] * 2;
            *(uint16_t *)
             ((long)&(((vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                        *)((long)local_108.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 8))->
                     super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar30 * 4 + lVar26) =
                 *puVar25 * 2;
            uVar30 = uVar30 + 1;
            puVar25 = puVar25 + 3;
          } while ((uVar30 & 0xffff) <= uVar18 && uVar18 - (uVar30 & 0xffff) != 0);
        }
        uVar19 = uVar19 + 1;
        uVar30 = (ulong)(uVar19 & 0xffff);
      } while (uVar30 <= uVar29 && uVar29 - uVar30 != 0);
      if (1 < uVar29) {
        local_b0 = (pointer)local_c8.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        local_d0 = (pointer)local_108.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start;
        local_68 = (vector<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                    *)((long)local_108.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + 8);
        local_ec = (uint)CONCAT62((int6)((ulong)local_68 >> 0x10),1);
        uVar30 = 1;
        local_70 = pcVar16;
        do {
          pptVar10 = pcVar16[uVar30].sibling_connectors.
                     super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          lVar26 = (long)pcVar16[uVar30].sibling_connectors.
                         super__Vector_base<const_chipemu::implementation::transdef_*,_std::allocator<const_chipemu::implementation::transdef_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pptVar10;
          local_78 = uVar29;
          if (lVar26 != 0) {
            uVar31 = *(ushort *)
                      ((bool *)local_c8.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start + uVar30 * 2);
            uVar4 = *(ushort *)
                     ((undefined1 *)
                      ((long)local_108.
                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                             _M_impl.super__Vector_impl_data._M_start + 2) + (ulong)uVar31 * 2);
            uVar30 = 0;
            uVar27 = 0;
            do {
              ptVar23 = pptVar10[uVar30];
              uVar28 = *(ushort *)
                        ((bool *)local_c8.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                        (ulong)ptVar23->gate * 2);
              uVar18 = (ulong)uVar28;
              uVar5 = *(ushort *)
                       ((undefined1 *)
                        ((long)local_108.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start + 2) + uVar18 * 2);
              bVar32 = uVar5 != 0;
              if (bVar32) {
                bVar32 = true;
                lVar20 = 0;
                sVar21 = 0;
                do {
                  uVar12 = *(ushort *)((long)local_68 + lVar20 * 4 + uVar18 * 2 + -2) >> 1;
                  if ((uVar12 == ptVar23->c1) &&
                     (*(ushort *)
                       ((long)&(local_68->
                               super__Vector_base<chipemu::implementation::transdef,_std::allocator<chipemu::implementation::transdef>_>
                               )._M_impl.super__Vector_impl_data._M_start + lVar20 * 4 + uVar18 * 2)
                      >> 1 == ptVar23->c2)) {
                    if (uVar12 == (ushort)local_ec) {
                      uVar28 = (uVar28 - sVar21) + 4;
                    }
                    else {
                      uVar28 = (uVar28 - sVar21) + 3;
                    }
                    break;
                  }
                  lVar20 = lVar20 + 1;
                  bVar32 = (ushort)lVar20 < uVar5;
                  sVar21 = sVar21 + -2;
                } while (uVar5 != (ushort)lVar20);
              }
              if (!bVar32) {
                this_00 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(this_00,"building nodes");
                __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              *(ushort *)
               ((undefined1 *)
                ((long)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       ._M_impl.super__Vector_impl_data._M_start + 6) +
               uVar30 * 2 + (ulong)uVar4 * 4 + (ulong)uVar31 * 2) = uVar28;
              uVar27 = uVar27 + 1;
              uVar30 = (ulong)uVar27;
            } while (uVar30 < (ulong)(lVar26 >> 3));
          }
          local_ec = local_ec + 1;
          uVar30 = (ulong)(local_ec & 0xffff);
        } while (uVar30 < uVar29);
      }
    }
  }
  std::
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  ::
  pair<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_&,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_&,_true>
            (&local_60,&local_c8,&local_108);
  pcVar15 = local_80;
  pnVar14 = local_110;
  if ((pointer)local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
               .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign(local_98,&local_60);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::_M_move_assign
            (local_90,&local_60.second);
  if (local_60.second.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.second.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.second.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.second.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((transdef *)
      local_60.first.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (transdef *)0x0) {
    operator_delete(local_60.first.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.first.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.first.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  uVar19 = pcVar15->node_count;
  pnVar14->desc_nodes_count = (uint16_t)uVar19;
  pnVar14->desc_transistor_count = (uint16_t)pcVar15->transistor_count;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (local_88,(ulong)((uVar19 & 0xffff) << 5));
  puVar11 = (pnVar14->changed_queue).
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start;
  (pnVar14->changed_feeding)._M_current = puVar11;
  (pnVar14->changed_eating)._M_current = puVar11;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (local_a0,(ulong)pnVar14->desc_nodes_count);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (local_a8,(ulong)pnVar14->desc_nodes_count << 5);
  puVar3 = (pnVar14->nodes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start +
           (pnVar14->node_offsets).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start[pnVar14->power];
  *puVar3 = *puVar3 | 4;
  std::
  vector<chipemu::implementation::(anonymous_namespace)::construct_node,_std::allocator<chipemu::implementation::(anonymous_namespace)::construct_node>_>
  ::~vector(&local_e8);
  return;
}

Assistant:

nmos::nmos(const chip_description& desc):
    power(desc.node_power),
    ground(desc.node_ground)
{
    auto cnodes = create_construct_nodes(desc);
    setup_transistors(desc, cnodes);
    tie(node_offsets, nodes) = create_nodes(cnodes);
    desc_nodes_count = desc.node_count;
    desc_transistor_count = desc.transistor_count;
    changed_queue_init();
    change_order.resize(node_count());
    group_init();
    node_addr(power)[0] |= node_is_high;
}